

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void biffread(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  int iVar2;
  uint uVar3;
  uint i;
  size_t sVar4;
  char *pcVar5;
  long in_RDI;
  int found_nl;
  uint res_total;
  uint len_1;
  uchar *src;
  uchar *dst;
  uchar buf_1 [257];
  int bin_mode;
  ushort len;
  runsdef val;
  char buf [32];
  char typ;
  osfildef *fp;
  runcxdef *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  dattyp in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  uchar *local_178;
  uchar *local_170;
  uchar local_168 [40];
  runsdef *in_stack_fffffffffffffec0;
  runsdef *in_stack_fffffffffffffec8;
  runsdef *in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  runcxdef *in_stack_fffffffffffffee0;
  int local_60;
  runsdef local_58;
  undefined1 local_48 [47];
  char local_19;
  FILE *local_18;
  long local_8;
  
  local_8 = in_RDI;
  local_18 = (FILE *)bif_get_file((bifcxdef *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  (int *)CONCAT44(in_stack_fffffffffffffe7c,
                                                  in_stack_fffffffffffffe78),
                                  (int *)in_stack_fffffffffffffe70);
  if (local_60 == 0) {
    uVar3 = 0x202;
    if ((uint)((int)*(undefined8 *)(*(long *)(local_8 + 8) + 0x40) -
              (int)*(undefined8 *)(*(long *)(local_8 + 8) + 0x38)) < 0x203) {
      runhcmp(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
              in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    }
    local_58.runstyp = '\x03';
    local_58.runsv =
         (anon_union_8_4_1dda36f5_for_runsv)
         ((anon_union_8_4_1dda36f5_for_runsv *)(*(long *)(local_8 + 8) + 0x38))->runsvnum;
    local_170 = (uchar *)(*(long *)(*(long *)(local_8 + 8) + 0x38) + 2);
    iVar2 = 0;
    while (iVar2 == 0) {
      pcVar5 = fgets((char *)local_168,0x100,local_18);
      if (pcVar5 == (char *)0x0) {
        if (iVar2 == 0) goto LAB_0026dedf;
        break;
      }
      for (local_178 = local_168; *local_178 != '\0'; local_178 = local_178 + 1) {
        uVar1 = *local_178;
        if (uVar1 == '\t') {
          *local_170 = '\\';
          local_170[1] = 't';
          local_170 = local_170 + 1;
        }
        else if ((uVar1 == '\n') || (uVar1 == '\r')) {
          *local_170 = '\\';
          local_170[1] = 'n';
          iVar2 = 1;
          local_170 = local_170 + 1;
        }
        else if (uVar1 == '\\') {
          *local_170 = '\\';
          local_170[1] = '\\';
          local_170 = local_170 + 1;
        }
        else {
          *local_170 = *local_178;
        }
        local_170 = local_170 + 1;
      }
      if (iVar2 == 0) {
        uVar3 = uVar3 + 0x202;
        i = (int)local_170 - (int)local_58.runsv.runsvnum;
        oswp2(local_58.runsv.runsvstr,i);
        if ((uint)((int)*(undefined8 *)(*(long *)(local_8 + 8) + 0x40) -
                  (int)*(undefined8 *)(*(long *)(local_8 + 8) + 0x38)) <= uVar3) {
          runhcmp(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                  in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        }
        if ((void *)local_58.runsv.runsvnum != *(void **)(*(long *)(local_8 + 8) + 0x38)) {
          memmove(*(void **)(*(long *)(local_8 + 8) + 0x38),local_58.runsv.runsvstr,(ulong)i);
          local_58.runsv =
               (anon_union_8_4_1dda36f5_for_runsv)
               ((anon_union_8_4_1dda36f5_for_runsv *)(*(long *)(local_8 + 8) + 0x38))->runsvnum;
        }
        local_170 = local_58.runsv.runsvstr + i;
      }
    }
    uVar3 = (int)local_170 - (int)local_58.runsv.runsvnum;
    oswp2(local_58.runsv.runsvstr,uVar3);
    *(ulong *)(*(long *)(local_8 + 8) + 0x38) =
         *(long *)(*(long *)(local_8 + 8) + 0x38) + (ulong)uVar3;
    runrepush(*(runcxdef **)(local_8 + 8),&local_58);
  }
  else {
    sVar4 = fread(&local_19,1,1,local_18);
    if (sVar4 == 1) {
      iVar2 = (int)local_19;
      if (iVar2 == 1) {
        sVar4 = fread(local_48,4,1,local_18);
        if (sVar4 == 1) {
          osrp4s(local_48);
          runpnum((runcxdef *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  CONCAT44(in_stack_fffffffffffffe7c,iVar2));
          return;
        }
      }
      else if (iVar2 == 3) {
        sVar4 = fread(local_48,2,1,local_18);
        if (sVar4 == 1) {
          uVar3 = osrp2(local_48);
          if ((uint)((int)*(undefined8 *)(*(long *)(local_8 + 8) + 0x40) -
                    (int)*(undefined8 *)(*(long *)(local_8 + 8) + 0x38)) <= (uVar3 & 0xffff)) {
            runhcmp(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                    in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          }
          sVar4 = fread((void *)(*(long *)(*(long *)(local_8 + 8) + 0x38) + 2),
                        (long)(int)((uVar3 & 0xffff) - 2),1,local_18);
          if (sVar4 == 1) {
            oswp2(*(void **)(*(long *)(local_8 + 8) + 0x38),uVar3 & 0xffff);
            local_58.runstyp = '\x03';
            local_58.runsv = *(anon_union_8_4_1dda36f5_for_runsv *)(*(long *)(local_8 + 8) + 0x38);
            *(long *)(*(long *)(local_8 + 8) + 0x38) =
                 *(long *)(*(long *)(local_8 + 8) + 0x38) + (long)(int)(uVar3 & 0xffff);
            runrepush(*(runcxdef **)(local_8 + 8),&local_58);
            return;
          }
        }
      }
      else if (iVar2 == 8) {
        local_58.runstyp = '\b';
        runpush((runcxdef *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                in_stack_fffffffffffffe7c,(runsdef *)in_stack_fffffffffffffe70);
        return;
      }
    }
LAB_0026dedf:
    runpnil(in_stack_fffffffffffffe70);
  }
  return;
}

Assistant:

void biffread(bifcxdef *ctx, int argc)
{
    osfildef *fp;
    char      typ;
    char      buf[32];
    runsdef   val;
    ushort    len;
    int       bin_mode;

    /* get the file pointer */
    bifcntargs(ctx, 1, argc);
    fp = bif_get_file(ctx, (int *)0, &bin_mode);

    if (bin_mode)
    {
        /* binary file - read the type byte */
        if (osfrb(fp, &typ, 1))
            goto ret_error;
        
        /* read the data according to the type */
        switch(typ)
        {
        case DAT_NUMBER:
            if (osfrb(fp, buf, 4))
                goto ret_error;
            runpnum(ctx->bifcxrun, osrp4s(buf));
            break;
            
        case DAT_SSTRING:
            /* get the size */
            if (osfrb(fp, buf, 2))
                goto ret_error;
            len = osrp2(buf);
            
            /* reserve space */
            runhres(ctx->bifcxrun, len, 0);
            
            /* read the string into the reserved space */
            if (osfrb(fp, ctx->bifcxrun->runcxhp + 2, len - 2))
                goto ret_error;
            
            /* set up the string */
            oswp2(ctx->bifcxrun->runcxhp, len);
            val.runstyp = DAT_SSTRING;
            val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
            
            /* consume the space */
            ctx->bifcxrun->runcxhp += len;
            
            /* push the value */
            runrepush(ctx->bifcxrun, &val);
            break;
            
        case DAT_TRUE:
            val.runstyp = DAT_TRUE;
            runpush(ctx->bifcxrun, DAT_TRUE, &val);
            break;
            
        default:
            goto ret_error;
        }
    }
    else
    {
        uchar  buf[257];
        uchar *dst;
        uchar *src;
        uint   len;
        uint   res_total;
        int    found_nl;

        /* 
         *   reserve some space in the heap - we'll initially reserve
         *   space for twice our buffer, in case every single character
         *   needs to be expanded into an escape sequence
         */
        res_total = sizeof(buf) * 2;
        runhres(ctx->bifcxrun, res_total, 0);

        /* set up our output value */
        val.runstyp = DAT_SSTRING;
        val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
        dst = ctx->bifcxrun->runcxhp + 2;

        /* keep going until we find a newline or run out of data */
        for (found_nl = FALSE ; !found_nl ; )
        {
            /* text-mode - read the result into our buffer */
            if (!osfgets((char *)buf, sizeof(buf) - 1, fp))
            {
                /* 
                 *   if we found a newline, return what we have;
                 *   otherwise, return an error 
                 */
                if (found_nl)
                    break;
                else
                    goto ret_error;
            }
            
            /* 
             *   make sure it's null-terminated, in case the buffer was
             *   full 
             */
            buf[256] = '\0';
            
            /* translate into the heap area we've reserved */
            for (src = buf ; *src != '\0' ; ++src, ++dst)
            {
                /* determine if we need translations */
                switch(*src)
                {
                case '\n':
                case '\r':
                    /* translate to a newline sequence */
                    *dst++ = '\\';
                    *dst = 'n';
                    
                    /* note that we've found our newline */
                    found_nl = TRUE;
                    break;
                    
                case '\t':
                    /* translate to a tab sequence */
                    *dst++ = '\\';
                    *dst = 't';
                    break;
                    
                case '\\':
                    /* expand to a double-backslash sequence */
                    *dst++ = '\\';
                    *dst = '\\';
                    break;

                default:
                    /* leave other characters intact */
                    *dst = *src;
                    break;
                }
            }

            /*
             *   If we didn't find the newline, we'll need more space.
             *   This is a bit tricky, because the space we've already set
             *   up may move if we compact the heap while asking for more
             *   space.  So, remember our current length, reserve another
             *   buffer-full of space, and set everything up at the new
             *   output location if necessary.  
             */
            if (!found_nl)
            {
                /* reserve another buffer-full (double for expansion) */
                res_total += sizeof(buf) * 2;

                /* note our current offset */
                len = dst - val.runsv.runsvstr;
                oswp2(val.runsv.runsvstr, len);

                /* ask for the space */
                runhres(ctx->bifcxrun, res_total, 0);

                /* 
                 *   Since we were at the top of the heap before, we
                 *   should still be at the top of the heap.  If not,
                 *   we'll have to copy from our old location to the new
                 *   top of the heap.  
                 */
                if (val.runsv.runsvstr != ctx->bifcxrun->runcxhp)
                {
                    /* copy our existing text to our new location */
                    memmove(ctx->bifcxrun->runcxhp, val.runsv.runsvstr, len);

                    /* fix up our pointer */
                    val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
                }

                /* re-establish our output pointer at our new location */
                dst = val.runsv.runsvstr + len;
            }
        }

        /* finish setting up the string */
        len = dst - val.runsv.runsvstr;
        oswp2(val.runsv.runsvstr, len);

        /* consume the space */
        ctx->bifcxrun->runcxhp += len;

        /* push the value */
        runrepush(ctx->bifcxrun, &val);
    }

    /* success - we've already pushed the return value */
    return;

ret_error:
    runpnil(ctx->bifcxrun);
}